

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

errr parser_reg(parser *p,char *fmt,_func_parser_error_parser_ptr *func)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  parser_hook *h;
  char *__s;
  char *pcVar4;
  char *str;
  parser_spec *ppVar5;
  parser_spec *ppVar6;
  errr eVar7;
  uint uVar8;
  
  if (p == (parser *)0x0) {
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/parser.c"
                  ,0x1eb,
                  "errr parser_reg(struct parser *, const char *, enum parser_error (*)(struct parser *))"
                 );
  }
  if (fmt == (char *)0x0) {
    __assert_fail("fmt",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/parser.c"
                  ,0x1ec,
                  "errr parser_reg(struct parser *, const char *, enum parser_error (*)(struct parser *))"
                 );
  }
  if (func == (_func_parser_error_parser_ptr *)0x0) {
    __assert_fail("func",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/parser.c"
                  ,0x1ed,
                  "errr parser_reg(struct parser *, const char *, enum parser_error (*)(struct parser *))"
                 );
  }
  h = (parser_hook *)mem_alloc(0x28);
  __s = string_make(fmt);
  h->next = p->hooks;
  h->func = func;
  if (__s == (char *)0x0) {
    __assert_fail("fmt",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/parser.c"
                  ,0x1a4,"errr parse_specs(struct parser_hook *, char *)");
  }
  pcVar4 = strtok(__s," ");
  if (pcVar4 == (char *)0x0) {
LAB_001a55ce:
    mem_free(h);
    eVar7 = -0x16;
  }
  else {
    pcVar4 = string_make(pcVar4);
    h->dir = pcVar4;
    h->fhead = (parser_spec *)0x0;
    ppVar5 = (parser_spec *)0x0;
    while( true ) {
      h->ftail = ppVar5;
      pcVar4 = strtok((char *)0x0," ");
      if (pcVar4 == (char *)0x0) break;
      str = strtok((char *)0x0," ");
      if (str == (char *)0x0) {
LAB_001a55c1:
        clean_specs(h);
        goto LAB_001a55ce;
      }
      cVar1 = *pcVar4;
      pcVar4 = pcVar4 + (cVar1 == '?');
      iVar2 = strcmp(pcVar4,"int");
      uVar8 = (uint)(cVar1 == '?');
      if (iVar2 == 0) {
        uVar8 = uVar8 | 2;
      }
      else {
        iVar2 = strcmp(pcVar4,"sym");
        if (iVar2 == 0) {
          uVar8 = uVar8 | 4;
        }
        else {
          iVar2 = strcmp(pcVar4,"str");
          if (iVar2 == 0) {
            uVar8 = uVar8 | 6;
          }
          else {
            iVar2 = strcmp(pcVar4,"rand");
            if (iVar2 == 0) {
              uVar8 = uVar8 | 8;
            }
            else {
              iVar2 = strcmp(pcVar4,"uint");
              if (iVar2 == 0) {
                uVar8 = uVar8 | 10;
              }
              else {
                iVar2 = strcmp(pcVar4,"char");
                if (iVar2 != 0) goto LAB_001a55c1;
                uVar8 = uVar8 | 0xc;
              }
            }
          }
        }
      }
      ppVar5 = h->ftail;
      if ((uVar8 & 1) == 0) {
        if (ppVar5 != (parser_spec *)0x0) {
          uVar3 = ppVar5->type;
          if ((uVar3 & 1) == 0) goto LAB_001a5584;
          goto LAB_001a55c1;
        }
      }
      else if (ppVar5 != (parser_spec *)0x0) {
        uVar3 = ppVar5->type;
LAB_001a5584:
        if ((uVar3 & 0xfffffffe) == 6) goto LAB_001a55c1;
      }
      ppVar5 = (parser_spec *)mem_alloc(0x18);
      ppVar5->type = uVar8;
      pcVar4 = string_make(str);
      ppVar5->name = pcVar4;
      ppVar5->next = (parser_spec *)0x0;
      ppVar6 = (parser_spec *)&h->fhead;
      if (h->fhead != (parser_spec *)0x0) {
        ppVar6 = h->ftail;
      }
      ppVar6->next = ppVar5;
    }
    p->hooks = h;
    eVar7 = 0;
  }
  mem_free(__s);
  return eVar7;
}

Assistant:

errr parser_reg(struct parser *p, const char *fmt,
                enum parser_error (*func)(struct parser *p)) {
	errr r;
	char *cfmt;
	struct parser_hook *h;

	assert(p);
	assert(fmt);
	assert(func);

	h = mem_alloc(sizeof *h);
	cfmt = string_make(fmt);
	h->next = p->hooks;
	h->func = func;
	r = parse_specs(h, cfmt);
	if (r)
	{
		mem_free(h);
		mem_free(cfmt);
		return r;
	}

	p->hooks = h;
	mem_free(cfmt);
	return 0;
}